

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O0

void icu_63::getDefaultTZName(UnicodeString *tzid,UBool isDST,UnicodeString *zonename)

{
  ConstChar16Ptr local_c0;
  UnicodeString local_b8;
  ConstChar16Ptr local_68;
  UnicodeString local_60;
  UnicodeString *local_20;
  UnicodeString *zonename_local;
  UnicodeString *pUStack_10;
  UBool isDST_local;
  UnicodeString *tzid_local;
  
  local_20 = zonename;
  zonename_local._7_1_ = isDST;
  pUStack_10 = tzid;
  UnicodeString::operator=(zonename,tzid);
  if (zonename_local._7_1_ == '\0') {
    ConstChar16Ptr::ConstChar16Ptr(&local_c0,L"(STD)");
    UnicodeString::UnicodeString(&local_b8,'\x01',&local_c0,-1);
    UnicodeString::operator+=(local_20,&local_b8);
    UnicodeString::~UnicodeString(&local_b8);
    ConstChar16Ptr::~ConstChar16Ptr(&local_c0);
  }
  else {
    ConstChar16Ptr::ConstChar16Ptr(&local_68,L"(DST)");
    UnicodeString::UnicodeString(&local_60,'\x01',&local_68,-1);
    UnicodeString::operator+=(local_20,&local_60);
    UnicodeString::~UnicodeString(&local_60);
    ConstChar16Ptr::~ConstChar16Ptr(&local_68);
  }
  return;
}

Assistant:

static void getDefaultTZName(const UnicodeString &tzid, UBool isDST, UnicodeString& zonename) {
    zonename = tzid;
    if (isDST) {
        zonename += UNICODE_STRING_SIMPLE("(DST)");
    } else {
        zonename += UNICODE_STRING_SIMPLE("(STD)");
    }
}